

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O1

bool UnifiedRegex::CaseInsensitive::RangeToEquivClass
               (uint *tblidx,uint l,uint h,uint *acth,codepoint_t *equivl)

{
  uint uVar1;
  code *pcVar2;
  uint c;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  uint *puVar7;
  int i;
  long lVar8;
  uint uVar9;
  
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CaseInsensitive.cpp"
                       ,0x1ce,"(l <= h)","l <= h");
    if (!bVar3) {
LAB_00e6b5cc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if ((l < 0x118e0) && (uVar6 = (ulong)*tblidx, uVar6 < 0x16d)) {
    puVar7 = (uint *)(transforms + uVar6 * 0x1c + 8);
    bVar3 = true;
    do {
      if ((l <= *puVar7) && (*(byte *)((long)puVar7 + -7) < 2)) {
        if (bVar3) {
          lVar8 = (uVar6 & 0xffffffff) * 0x1c;
          uVar1 = *(uint *)(transforms + lVar8 + 4);
          c = l;
          if (l < uVar1) {
            c = uVar1;
          }
          uVar9 = c;
          if (transforms[lVar8] == '\x01') {
            uVar9 = *(uint *)(transforms + lVar8 + 8);
          }
          bVar3 = false;
          if (h <= uVar9) {
            uVar9 = h;
          }
          if (c <= uVar9) {
            if (l < uVar1) {
              *acth = c - 1;
              lVar8 = 0;
              do {
                equivl[lVar8] = l;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 4);
              bVar3 = false;
            }
            else {
              *acth = uVar9;
              Transform::Apply<unsigned_int>
                        ((Transform *)(transforms + (ulong)*tblidx * 0x1c),c,equivl);
              bVar3 = true;
            }
          }
          if (c <= uVar9) {
            return bVar3;
          }
        }
        break;
      }
      uVar4 = (uint)(uVar6 + 1);
      *tblidx = uVar4;
      bVar3 = uVar6 < 0x16c;
      puVar7 = puVar7 + 7;
      uVar6 = uVar6 + 1;
    } while (uVar4 != 0x16d);
  }
  *acth = h;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  lVar8 = 0;
  do {
    if (0x10ffff < l) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xbd,"(u <= MaxUChar)","u <= MaxUChar");
      if (!bVar3) goto LAB_00e6b5cc;
      *puVar5 = 0;
    }
    equivl[lVar8] = l;
    lVar8 = lVar8 + 1;
    if (lVar8 == 4) {
      return false;
    }
  } while( true );
}

Assistant:

bool RangeToEquivClass(uint & tblidx, uint l, uint h, uint & acth, __out_ecount(EquivClassSize) codepoint_t equivl[EquivClassSize])
        {
            return RangeToEquivClass(tblidx, l, h, acth, equivl, [](MappingSource source) {
                return source == MappingSource::CaseFolding || source == MappingSource::UnicodeData;
            });
        }